

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O2

int point_mul_id_tc26_gost_3410_2012_512_paramSetC
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  char cVar2;
  byte arg1;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  int iVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  long lVar10;
  pt_prj_t_conflict4 *arg3;
  uint uVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  pt_prj_t_conflict4 lut;
  pt_prj_t_conflict4 Q;
  pt_aff_t_conflict4 local_1598;
  int8_t rnaf [103];
  pt_prj_t_conflict4 local_1438 [16];
  
  bVar14 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar7 = 0;
  if ((((pBVar6 != (BIGNUM *)0x0) &&
       (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar5,pBVar6,ctx), iVar3 != 0)) &&
      (iVar3 = BN_bn2lebinpad(pBVar5,b_x,0x40), iVar7 = iVar4, iVar3 == 0x40)) &&
     ((iVar4 = BN_bn2lebinpad(pBVar6,b_y,0x40), iVar4 == 0x40 &&
      (iVar4 = BN_bn2lebinpad(m,b_m,0x40), iVar4 == 0x40)))) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1598.X,b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1598.Y,b_y);
    rnaf[0x50] = '\0';
    rnaf[0x51] = '\0';
    rnaf[0x52] = '\0';
    rnaf[0x53] = '\0';
    rnaf[0x54] = '\0';
    rnaf[0x55] = '\0';
    rnaf[0x56] = '\0';
    rnaf[0x57] = '\0';
    rnaf[0x58] = '\0';
    rnaf[0x59] = '\0';
    rnaf[0x5a] = '\0';
    rnaf[0x5b] = '\0';
    rnaf[0x5c] = '\0';
    rnaf[0x5d] = '\0';
    rnaf[0x5e] = '\0';
    rnaf[0x40] = '\0';
    rnaf[0x41] = '\0';
    rnaf[0x42] = '\0';
    rnaf[0x43] = '\0';
    rnaf[0x44] = '\0';
    rnaf[0x45] = '\0';
    rnaf[0x46] = '\0';
    rnaf[0x47] = '\0';
    rnaf[0x48] = '\0';
    rnaf[0x49] = '\0';
    rnaf[0x4a] = '\0';
    rnaf[0x4b] = '\0';
    rnaf[0x4c] = '\0';
    rnaf[0x4d] = '\0';
    rnaf[0x4e] = '\0';
    rnaf[0x4f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0x34] = '\0';
    rnaf[0x35] = '\0';
    rnaf[0x36] = '\0';
    rnaf[0x37] = '\0';
    rnaf[0x38] = '\0';
    rnaf[0x39] = '\0';
    rnaf[0x3a] = '\0';
    rnaf[0x3b] = '\0';
    rnaf[0x3c] = '\0';
    rnaf[0x3d] = '\0';
    rnaf[0x3e] = '\0';
    rnaf[0x3f] = '\0';
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x5f] = '\0';
    rnaf[0x60] = '\0';
    rnaf[0x61] = '\0';
    rnaf[0x62] = '\0';
    rnaf[99] = '\0';
    rnaf[100] = '\0';
    rnaf[0x65] = '\0';
    rnaf[0x66] = '\0';
    lVar12 = 0;
    memset(&Q,0,0x140);
    memset(&lut,0,0x140);
    precomp_wnaf(local_1438,&local_1598);
    scalar_rwnaf(rnaf,b_m);
    iVar7 = (int)rnaf[0x66];
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      bVar13 = (int)(iVar7 + -1 >> 1 ^ (uint)lVar10) < 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (Q.X,bVar13,Q.X,(uint64_t *)((long)local_1438[0].X + lVar12));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (Q.Y,bVar13,Q.Y,(uint64_t *)((long)local_1438[0].Y + lVar12));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (Q.T,bVar13,Q.T,(uint64_t *)((long)local_1438[0].T + lVar12));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (Q.Z,bVar13,Q.Z,(uint64_t *)((long)local_1438[0].Z + lVar12));
      lVar12 = lVar12 + 0x140;
    }
    puVar1 = lut.T;
    for (uVar11 = 0x65; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
      iVar7 = 5;
      while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
        point_double(&Q,&Q);
      }
      cVar2 = rnaf[uVar11];
      arg3 = local_1438;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        bVar13 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                      (uint)lVar10) < 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.X,bVar13,lut.X,arg3->X);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.Y,bVar13,lut.Y,arg3->Y);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar1,bVar13,puVar1,arg3->T);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.Z,bVar13,lut.Z,arg3->Z);
        arg3 = arg3 + 1;
      }
      fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_1598.X,lut.X);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_1598.T,puVar1);
      arg1 = (byte)(cVar2 >> 7) >> 7;
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(lut.X,arg1,lut.X,local_1598.X);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar1,arg1,puVar1,local_1598.T);
      point_add_proj(&Q,&Q,&lut);
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(lut.X,local_1438[0].X);
    lVar10 = 10;
    puVar8 = local_1438[0].Y;
    puVar9 = lut.Y;
    for (lVar12 = lVar10; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(puVar1,local_1438[0].T);
    puVar8 = local_1438[0].Z;
    puVar9 = lut.Z;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
    }
    point_add_proj(&lut,&lut,&Q);
    bVar14 = b_m[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.X,bVar14,lut.X,Q.X);
    puVar8 = Q.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar8,bVar14,lut.Y,puVar8);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(Q.T,bVar14,puVar1,Q.T);
    puVar1 = Q.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar1,bVar14,lut.Z,puVar1);
    point_double(&Q,&Q);
    point_double(&Q,&Q);
    point_edwards2legacy(&Q,&Q);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(puVar1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1598.X,Q.X,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1598.Y,puVar8,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(b_x,local_1598.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(b_y,local_1598.Y);
    iVar7 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar7 == 0) && (iVar7 = CRYPTO_memcmp("",b_y,0x40), iVar7 == 0)) {
      iVar7 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar7 == 0) {
        iVar7 = 0;
        goto LAB_0013a2ab;
      }
    }
    else {
      lVar10 = BN_lebin2bn(b_x,0x40,pBVar5);
      iVar7 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(b_y,0x40,pBVar6), lVar10 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar4 == 0))))
      goto LAB_0013a2ab;
    }
    iVar7 = 1;
  }
LAB_0013a2ab:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar7;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetC(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}